

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode LocalizedText_encodeBinary(UA_LocalizedText *src,UA_DataType *_)

{
  UA_StatusCode UVar1;
  uint local_20;
  byte local_19;
  UA_StatusCode retval;
  UA_Byte encoding;
  UA_DataType *__local;
  UA_LocalizedText *src_local;
  
  local_19 = (src->locale).data != (UA_Byte *)0x0;
  if ((src->text).data != (UA_Byte *)0x0) {
    local_19 = local_19 | 2;
  }
  _retval = _;
  __local = (UA_DataType *)src;
  local_20 = Byte_encodeBinary(&local_19,(UA_DataType *)0x0);
  if ((local_19 & 1) != 0) {
    UVar1 = String_encodeBinary((UA_String *)__local,(UA_DataType *)0x0);
    local_20 = UVar1 | local_20;
  }
  if ((local_19 & 2) != 0) {
    UVar1 = String_encodeBinary(&(__local->typeId).identifier.string,(UA_DataType *)0x0);
    local_20 = UVar1 | local_20;
  }
  return local_20;
}

Assistant:

static UA_StatusCode
LocalizedText_encodeBinary(UA_LocalizedText const *src, const UA_DataType *_) {
    /* Set up the encoding mask */
    UA_Byte encoding = 0;
    if(src->locale.data)
        encoding |= UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_LOCALE;
    if(src->text.data)
        encoding |= UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_TEXT;

    /* Encode the content */
    UA_StatusCode retval = Byte_encodeBinary(&encoding, NULL);
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_LOCALE)
        retval |= String_encodeBinary(&src->locale, NULL);
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_TEXT)
        retval |= String_encodeBinary(&src->text, NULL);
    return retval;
}